

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

string_view __thiscall
absl::lts_20250127::cord_internal::anon_unknown_0::
Consume<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
          (anon_unknown_0 *this,char *dst,string_view s,size_t n)

{
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  string_view sVar2;
  string_view s_local;
  
  s_local._M_str = (char *)s._M_len;
  s_local._M_len = (size_t)dst;
  memcpy(this,s_local._M_str,(size_t)s._M_str);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&s_local,(size_type)s._M_str,0xffffffffffffffff);
  sVar2._M_len = bVar1._M_len;
  sVar2._M_str = bVar1._M_str;
  return sVar2;
}

Assistant:

inline absl::string_view Consume(char* dst, absl::string_view s, size_t n) {
  if (edge_type == kBack) {
    memcpy(dst, s.data(), n);
    return s.substr(n);
  } else {
    const size_t offset = s.size() - n;
    memcpy(dst, s.data() + offset, n);
    return s.substr(0, offset);
  }
}